

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_member_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  uint32_t id;
  Decoration *pDVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  mapped_type *pmVar5;
  uint *puVar6;
  uint *ts_1;
  uint32_t local_1c;
  
  while ((id = (type->type_alias).id, local_1c = index, id != 0 &&
         (bVar4 = Compiler::has_extended_decoration
                            (&this->super_Compiler,id,SPIRVCrossDecorationBufferBlockRepacked),
         !bVar4))) {
    type = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (type->type_alias).id);
    index = local_1c;
  }
  pmVar5 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
  puVar6 = (uint *)(ulong)local_1c;
  ts_1 = puVar6;
  if (puVar6 < (uint *)(pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size
     ) {
    pDVar1 = (pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    ts_1 = (uint *)((long)puVar6 * 0x160);
    sVar2 = pDVar1[(long)puVar6].alias._M_string_length;
    if (sVar2 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = pDVar1[(long)puVar6].alias._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
      return __return_storage_ptr__;
    }
  }
  join<char_const(&)[3],unsigned_int&>
            (__return_storage_ptr__,(spirv_cross *)0x2f56ad,(char (*) [3])&local_1c,ts_1);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_member_name(const SPIRType &type, uint32_t index)
{
	if (type.type_alias != TypeID(0) &&
	    !has_extended_decoration(type.type_alias, SPIRVCrossDecorationBufferBlockRepacked))
	{
		return to_member_name(get<SPIRType>(type.type_alias), index);
	}

	auto &memb = ir.meta[type.self].members;
	if (index < memb.size() && !memb[index].alias.empty())
		return memb[index].alias;
	else
		return join("_m", index);
}